

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  Cookie *pCVar5;
  size_t *__base;
  ulong local_78;
  size_t i;
  Cookie **array;
  size_t myhash;
  ulong uStack_58;
  _Bool is_ip;
  size_t matches;
  Cookie *mainco;
  Cookie *co;
  Cookie *newco;
  _Bool secure_local;
  char *path_local;
  char *host_local;
  CookieInfo *c_local;
  Curl_easy *data_local;
  
  matches = 0;
  uStack_58 = 0;
  sVar4 = cookiehash(host);
  if ((c == (CookieInfo *)0x0) || (c->cookies[sVar4] == (Cookie *)0x0)) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    remove_expired(c);
    _Var1 = Curl_host_is_ipnum(host);
    for (mainco = c->cookies[sVar4]; mainco != (Cookie *)0x0; mainco = mainco->next) {
      if (((((mainco->secure & 1U) == 0) || (secure)) &&
          (((mainco->domain == (char *)0x0 ||
            ((((mainco->tailmatch & 1U) != 0 && (!_Var1)) &&
             (_Var2 = tailmatch(mainco->domain,host), _Var2)))) ||
           ((((mainco->tailmatch & 1U) == 0 || (_Var1)) &&
            (iVar3 = Curl_strcasecompare(host,mainco->domain), iVar3 != 0)))))) &&
         ((mainco->spath == (char *)0x0 || (_Var2 = pathmatch(mainco->spath,path), _Var2)))) {
        pCVar5 = dup_cookie(mainco);
        if (pCVar5 == (Cookie *)0x0) goto LAB_00a1f12a;
        pCVar5->next = (Cookie *)matches;
        uStack_58 = uStack_58 + 1;
        matches = (size_t)pCVar5;
        if (0x95 < uStack_58) {
          Curl_infof(data,"Included max number of cookies (%zu) in request!",uStack_58);
          break;
        }
      }
    }
    if (uStack_58 != 0) {
      __base = (size_t *)(*Curl_cmalloc)(uStack_58 << 3);
      if (__base == (size_t *)0x0) {
LAB_00a1f12a:
        Curl_cookie_freelist((Cookie *)matches);
        return (Cookie *)0x0;
      }
      local_78 = 0;
      for (mainco = (Cookie *)matches; mainco != (Cookie *)0x0; mainco = mainco->next) {
        __base[local_78] = (size_t)mainco;
        local_78 = local_78 + 1;
      }
      qsort(__base,uStack_58,8,cookie_sort);
      matches = *__base;
      for (local_78 = 0; local_78 < uStack_58 - 1; local_78 = local_78 + 1) {
        *(size_t *)__base[local_78] = __base[local_78 + 1];
      }
      *(undefined8 *)__base[uStack_58 - 1] = 0;
      (*Curl_cfree)(__base);
    }
    data_local = (Curl_easy *)matches;
  }
  return (Cookie *)data_local;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}